

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmAddCacheDefinition(void *arg,char *name,char *value,char *doc,int type)

{
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_59;
  string local_58;
  void *local_38;
  cmMakefile *mf;
  char *pcStack_28;
  int type_local;
  char *doc_local;
  char *value_local;
  char *name_local;
  void *arg_local;
  
  local_38 = arg;
  mf._4_4_ = type;
  pcStack_28 = doc;
  doc_local = value;
  value_local = name;
  name_local = (char *)arg;
  switch(type) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,name,&local_59);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_58,doc_local,pcStack_28,BOOL,false);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,name,&local_91);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_90,doc_local,pcStack_28,PATH,false);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,name,&local_b9);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_b8,doc_local,pcStack_28,FILEPATH,false);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,name,&local_e1);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_e0,doc_local,pcStack_28,STRING,false);
    std::__cxx11::string::~string((string *)&local_e0);
    std::allocator<char>::~allocator(&local_e1);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,name,&local_109);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_108,doc_local,pcStack_28,INTERNAL,false)
    ;
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,name,&local_131);
    cmMakefile::AddCacheDefinition((cmMakefile *)arg,&local_130,doc_local,pcStack_28,STATIC,false);
    std::__cxx11::string::~string((string *)&local_130);
    std::allocator<char>::~allocator(&local_131);
  }
  return;
}

Assistant:

static void CCONV cmAddCacheDefinition(void* arg, const char* name,
                                       const char* value, const char* doc,
                                       int type)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);

  switch (type) {
    case CM_CACHE_BOOL:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::BOOL);
      break;
    case CM_CACHE_PATH:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::PATH);
      break;
    case CM_CACHE_FILEPATH:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::FILEPATH);
      break;
    case CM_CACHE_STRING:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::STRING);
      break;
    case CM_CACHE_INTERNAL:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::INTERNAL);
      break;
    case CM_CACHE_STATIC:
      mf->AddCacheDefinition(name, value, doc, cmStateEnums::STATIC);
      break;
  }
}